

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

ostream * fasttext::operator<<(ostream *os,Vector *v)

{
  pointer pfVar1;
  ostream *poVar2;
  int64_t j;
  long lVar3;
  
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 5;
  for (lVar3 = 0;
      pfVar1 = (v->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar3 < (long)(v->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pfVar1 >> 2; lVar3 = lVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(os,pfVar1[lVar3]);
    std::operator<<(poVar2,' ');
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector& v) {
  os << std::setprecision(5);
  for (int64_t j = 0; j < v.size(); j++) {
    os << v[j] << ' ';
  }
  return os;
}